

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatInvalidInputTest_::
InvalidSubMessage<proto2_unittest::TestAllTypes>::TestBody
          (InvalidSubMessage<proto2_unittest::TestAllTypes> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_1;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  string_view data_03;
  AssertionResult gtest_ar_;
  TestAllTypes message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_398;
  AssertHelper local_390;
  internal local_388 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  string local_378;
  TestAllTypes local_358;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_358,(Arena *)0x0);
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_378,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,
             anon_var_dwarf_a12c75 + 5,0);
  data._M_str = local_378._M_dataplus._M_p;
  data._M_len = local_378._M_string_length;
  local_388[0] = (internal)MessageLite::ParseFromString((MessageLite *)&local_358,data);
  local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  paVar1 = &local_378.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar1) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_378,local_388,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\", 0))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x55b,local_378._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar1) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if (local_398._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_398._M_head_impl + 8))();
    }
  }
  if (local_380 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_380,local_380);
  }
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_378,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,"",1)
  ;
  data_00._M_str = local_378._M_dataplus._M_p;
  data_00._M_len = local_378._M_string_length;
  bVar2 = MessageLite::ParseFromString((MessageLite *)&local_358,data_00);
  local_388[0] = (internal)!bVar2;
  local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar1) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_378,local_388,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\0\", 1))","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x55f,local_378._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar1) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if (local_398._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_398._M_head_impl + 8))();
    }
  }
  if (local_380 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_380,local_380);
  }
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_378,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,
             anon_var_dwarf_845a4c,1);
  data_01._M_str = local_378._M_dataplus._M_p;
  data_01._M_len = local_378._M_string_length;
  bVar2 = MessageLite::ParseFromString((MessageLite *)&local_358,data_01);
  local_388[0] = (internal)!bVar2;
  local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar1) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_378,local_388,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\200\", 1))","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x563,local_378._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar1) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if (local_398._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_398._M_head_impl + 8))();
    }
  }
  if (local_380 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_380,local_380);
  }
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_378,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,"\f",
             1);
  data_02._M_str = local_378._M_dataplus._M_p;
  data_02._M_len = local_378._M_string_length;
  bVar2 = MessageLite::ParseFromString((MessageLite *)&local_358,data_02);
  local_388[0] = (internal)!bVar2;
  local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar1) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_378,local_388,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\014\", 1))","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x567,local_378._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar1) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if (local_398._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_398._M_head_impl + 8))();
    }
  }
  if (local_380 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_380,local_380);
  }
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_378,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,
             "\x0f",1);
  data_03._M_str = local_378._M_dataplus._M_p;
  data_03._M_len = local_378._M_string_length;
  bVar2 = MessageLite::ParseFromString((MessageLite *)&local_358,data_03);
  local_388[0] = (internal)!bVar2;
  local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar1) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_378,local_388,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\017\", 1))","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x56b,local_378._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar1) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if (local_398._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_398._M_head_impl + 8))();
    }
  }
  if (local_380 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_380,local_380);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_358);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatInvalidInputTest, InvalidSubMessage) {
  typename TestFixture::TestAllTypes message;

  // Control case.
  EXPECT_TRUE(message.ParseFromString(this->MakeInvalidEmbeddedMessage("", 0)));

  // The byte is a valid varint, but not a valid tag (zero).
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\0", 1)));

  // The byte is a malformed varint.
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\200", 1)));

  // The byte is an endgroup tag, but we aren't parsing a group.
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\014", 1)));

  // The byte is a valid varint but not a valid tag (bad wire type).
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\017", 1)));
}